

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O0

void scan_flux_vista(TrackData *trackdata)

{
  int bitcell_ns;
  FluxData *flux_revs;
  undefined1 local_c0 [8];
  BitBuffer bitbuf;
  FluxDecoder decoder;
  DataRate datarate;
  TrackData *trackdata_local;
  
  flux_revs = TrackData::flux(trackdata);
  bitcell_ns = ::bitcell_ns(_250K);
  FluxDecoder::FluxDecoder((FluxDecoder *)&bitbuf.m_wrapped,flux_revs,bitcell_ns,100,4);
  BitBuffer::BitBuffer((BitBuffer *)local_c0,_250K,(FluxDecoder *)&bitbuf.m_wrapped);
  TrackData::add(trackdata,(BitBuffer *)local_c0);
  scan_bitstream_vista(trackdata);
  BitBuffer::~BitBuffer((BitBuffer *)local_c0);
  return;
}

Assistant:

void scan_flux_vista(TrackData& trackdata)
{
    // Fixed data rate.
    auto datarate = DataRate::_250K;
    FluxDecoder decoder(trackdata.flux(), bitcell_ns(datarate));
    BitBuffer bitbuf(datarate, decoder);

    trackdata.add(std::move(bitbuf));
    scan_bitstream_vista(trackdata);
}